

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

bool __thiscall crunch::convert(crunch *this)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  pointer ppVar4;
  file_desc *this_00;
  file_desc *this_01;
  char *in_RDI;
  dynamic_string *in_stack_00000028;
  file_desc_vec *in_stack_00000030;
  crunch *in_stack_00000038;
  double total_time;
  timer tm;
  uint32 i;
  dynamic_string_array *strings;
  param_map_const_iterator it;
  param_map_const_iterator end;
  param_map_const_iterator begin;
  uint32 phase;
  uint32 total_input_specs;
  file_desc_vec files;
  file_desc_vec *in_stack_00000220;
  crunch *in_stack_00000228;
  bool local_e1;
  timer *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  file_desc *in_stack_ffffffffffffff30;
  command_line_params *in_stack_ffffffffffffff38;
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  *this_02;
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  *this_03;
  command_line_params *in_stack_ffffffffffffff80;
  uint local_5c;
  _Self local_50 [3];
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  local_38;
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  local_30;
  uint local_28;
  int local_24;
  bool local_1;
  
  crnlib::vector<crnlib::find_files::file_desc>::vector
            ((vector<crnlib::find_files::file_desc> *)&stack0xffffffffffffffe0);
  local_24 = 0;
  local_28 = 0;
  do {
    if (1 < local_28) {
      if (local_24 == 0) {
        crnlib::console::error("No input files specified!");
        local_1 = false;
      }
      else {
        bVar1 = crnlib::vector<crnlib::find_files::file_desc>::empty
                          ((vector<crnlib::find_files::file_desc> *)&stack0xffffffffffffffe0);
        if (bVar1) {
          crnlib::console::error("No files found to process!");
          local_1 = false;
        }
        else {
          crnlib::vector<crnlib::find_files::file_desc>::begin
                    ((vector<crnlib::find_files::file_desc> *)&stack0xffffffffffffffe0);
          crnlib::vector<crnlib::find_files::file_desc>::end
                    ((vector<crnlib::find_files::file_desc> *)&stack0xffffffffffffffe0);
          std::sort<crnlib::find_files::file_desc*>
                    (in_stack_ffffffffffffff30,
                     (file_desc *)
                     CONCAT17(in_stack_ffffffffffffff2f,
                              CONCAT16(in_stack_ffffffffffffff2e,
                                       CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                                      )));
          crnlib::vector<crnlib::find_files::file_desc>::begin
                    ((vector<crnlib::find_files::file_desc> *)&stack0xffffffffffffffe0);
          crnlib::vector<crnlib::find_files::file_desc>::end
                    ((vector<crnlib::find_files::file_desc> *)&stack0xffffffffffffffe0);
          this_00 = std::unique<crnlib::find_files::file_desc*>
                              (in_stack_ffffffffffffff30,
                               (file_desc *)
                               CONCAT17(in_stack_ffffffffffffff2f,
                                        CONCAT16(in_stack_ffffffffffffff2e,
                                                 CONCAT24(in_stack_ffffffffffffff2c,
                                                          in_stack_ffffffffffffff28))));
          this_01 = crnlib::vector<crnlib::find_files::file_desc>::begin
                              ((vector<crnlib::find_files::file_desc> *)&stack0xffffffffffffffe0);
          crnlib::vector<crnlib::find_files::file_desc>::resize
                    ((vector<crnlib::find_files::file_desc> *)this_01,
                     CONCAT13(in_stack_ffffffffffffff2f,
                              CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c)),
                     SUB41((uint)in_stack_ffffffffffffff28 >> 0x18,0));
          crnlib::timer::timer((timer *)0x110669);
          crnlib::timer::start(in_stack_ffffffffffffff20);
          uVar2 = process_files(in_stack_00000228,in_stack_00000220);
          if (((bool)uVar2) ||
             (in_stack_ffffffffffffff2e =
                   crnlib::command_line_params::get_value_as_bool
                             ((command_line_params *)this_00,(char *)this_01,
                              CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffff2e,
                                                      in_stack_ffffffffffffff2c)),
                              SUB41((uint)in_stack_ffffffffffffff28 >> 0x18,0)),
             (bool)in_stack_ffffffffffffff2e)) {
            in_stack_ffffffffffffff20 =
                 (timer *)crnlib::timer::get_elapsed_secs
                                    ((timer *)CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff2e,
                                                                      CONCAT24(
                                                  in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28))));
            crnlib::console::printf("Total time: %3.3fs",in_stack_ffffffffffffff20);
            local_e1 = true;
            if (*(int *)(in_RDI + 0x4c) == 0) {
              local_e1 = *(int *)(in_RDI + 0x44) != 0;
            }
            crnlib::console::printf
                      ((char *)(ulong)((uint)local_e1 * 3 + 2),
                       "%u total file(s) successfully processed, %u file(s) skipped, %u file(s) failed."
                       ,(ulong)*(uint *)(in_RDI + 0x48),(ulong)*(uint *)(in_RDI + 0x4c),
                       (ulong)*(uint *)(in_RDI + 0x44));
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
      }
LAB_00110773:
      crnlib::vector<crnlib::find_files::file_desc>::~vector
                ((vector<crnlib::find_files::file_desc> *)in_stack_ffffffffffffff20);
      return local_1;
    }
    this_02 = &local_30;
    std::
    _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
    ::_Rb_tree_const_iterator(this_02);
    this_03 = &local_38;
    std::
    _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
    ::_Rb_tree_const_iterator(this_03);
    crnlib::command_line_params::find(in_stack_ffffffffffffff80,in_RDI,this_03,this_02);
    local_50[0]._M_node = local_30._M_node;
    while (bVar1 = std::operator!=(local_50,&local_38), bVar1) {
      local_24 = local_24 + 1;
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                             *)in_stack_ffffffffffffff20);
      for (local_5c = 0;
          uVar3 = crnlib::vector<crnlib::dynamic_string>::size(&(ppVar4->second).m_values),
          local_5c < uVar3; local_5c = local_5c + 1) {
        crnlib::vector<crnlib::dynamic_string>::operator[](&(ppVar4->second).m_values,local_5c);
        bVar1 = process_input_spec(in_stack_00000038,in_stack_00000030,in_stack_00000028);
        if ((!bVar1) &&
           (bVar1 = crnlib::command_line_params::get_value_as_bool
                              (in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                               CONCAT13(in_stack_ffffffffffffff2f,
                                        CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c
                                                )),SUB41((uint)in_stack_ffffffffffffff28 >> 0x18,0))
           , !bVar1)) {
          local_1 = false;
          goto LAB_00110773;
        }
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                    *)in_stack_ffffffffffffff20);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool convert() {
    find_files::file_desc_vec files;

    uint32 total_input_specs = 0;

    for (uint32 phase = 0; phase < 2; phase++) {
      command_line_params::param_map_const_iterator begin, end;
      m_params.find(phase ? "" : "file", begin, end);
      for (command_line_params::param_map_const_iterator it = begin; it != end; ++it) {
        total_input_specs++;

        const dynamic_string_array& strings = it->second.m_values;
        for (uint32 i = 0; i < strings.size(); i++) {
          if (!process_input_spec(files, strings[i])) {
            if (!m_params.get_value_as_bool("ignoreerrors"))
              return false;
          }
        }
      }
    }

    if (!total_input_specs) {
      console::error("No input files specified!");
      return false;
    }

    if (files.empty()) {
      console::error("No files found to process!");
      return false;
    }

    std::sort(files.begin(), files.end());
    files.resize((uint32)(std::unique(files.begin(), files.end()) - files.begin()));

    timer tm;
    tm.start();

    if (!process_files(files)) {
      if (!m_params.get_value_as_bool("ignoreerrors"))
        return false;
    }

    double total_time = tm.get_elapsed_secs();

    console::printf("Total time: %3.3fs", total_time);

    console::printf(
        ((m_num_skipped) || (m_num_failed)) ? cWarningConsoleMessage : cInfoConsoleMessage,
        "%u total file(s) successfully processed, %u file(s) skipped, %u file(s) failed.", m_num_succeeded, m_num_skipped, m_num_failed);

    return true;
  }